

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O1

CScript * BuildScript<CScript,std::vector<unsigned_char,std::allocator<unsigned_char>>,opcodetype>
                    (CScript *__return_storage_ptr__,CScript *inputs,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *inputs_1,
                    opcodetype *inputs_2)

{
  long lVar1;
  pointer pbVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  if (0x1c < (__return_storage_ptr__->super_CScriptBase)._size) {
    free((__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect);
  }
  pcVar3 = (inputs->super_CScriptBase)._union.indirect_contents.indirect;
  uVar4 = *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 8);
  uVar5 = *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 0x14);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0xc) =
       *(undefined8 *)((long)&(inputs->super_CScriptBase)._union + 0xc);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x14) = uVar5;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = pcVar3;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = uVar4;
  (__return_storage_ptr__->super_CScriptBase)._size = (inputs->super_CScriptBase)._size;
  (inputs->super_CScriptBase)._size = 0;
  pbVar2 = (inputs_1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  b._M_extent._M_extent_value =
       (long)(inputs_1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pbVar2;
  b._M_ptr = pbVar2;
  CScript::operator<<(__return_storage_ptr__,b);
  CScript::operator<<(__return_storage_ptr__,*inputs_2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript BuildScript(Ts&&... inputs)
{
    CScript ret;
    int cnt{0};

    ([&ret, &cnt] (Ts&& input) {
        if constexpr (std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ts>>, CScript>) {
            // If it is a CScript, extend ret with it. Move or copy the first element instead.
            if (cnt == 0) {
                ret = std::forward<Ts>(input);
            } else {
                ret.insert(ret.end(), input.begin(), input.end());
            }
        } else {
            // Otherwise invoke CScript::operator<<.
            ret << input;
        }
        cnt++;
    } (std::forward<Ts>(inputs)), ...);

    return ret;
}